

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int ConvexDecomposition::calchull
              (float3 *verts,int verts_count,int **tris_out,int *tris_count,int vlimit)

{
  cbtHullTriangle *this;
  int iVar1;
  long lVar2;
  int j;
  long lVar3;
  Array<int> local_48;
  
  iVar1 = calchullgen(verts,verts_count,vlimit);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    local_48.element = (int *)0x0;
    local_48.count = 0;
    local_48.array_size = 0;
    if (DAT_00b6ffa0 < 1) {
      local_48.element = (int *)0x0;
      local_48.count = 0;
    }
    else {
      lVar2 = 0;
      lVar3 = tris;
      iVar1 = DAT_00b6ffa0;
      do {
        if (*(long *)(lVar3 + lVar2 * 8) != 0) {
          lVar3 = 0;
          do {
            if (DAT_00b6ffa0 <= lVar2) goto LAB_00907a85;
            Array<int>::Add(&local_48,*(int *)(*(long *)(tris + lVar2 * 8) + lVar3 * 4));
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          if (DAT_00b6ffa0 <= lVar2) {
LAB_00907a85:
            __assert_fail("i>=0 && i<count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x577,
                          "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
                         );
          }
          this = *(cbtHullTriangle **)(tris + lVar2 * 8);
          if (this != (cbtHullTriangle *)0x0) {
            cbtHullTriangle::~cbtHullTriangle(this);
          }
          operator_delete(this,0x24);
          lVar3 = tris;
          iVar1 = DAT_00b6ffa0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      local_48.count = local_48.count / 3;
    }
    *tris_count = local_48.count;
    *tris_out = local_48.element;
    iVar1 = 1;
    DAT_00b6ffa0 = 0;
  }
  return iVar1;
}

Assistant:

int calchull(float3 *verts,int verts_count, int *&tris_out, int &tris_count,int vlimit) 
{
	int rc=calchullgen(verts,verts_count,  vlimit) ;
	if(!rc) return 0;
	Array<int> ts;
	for(int i=0;i<tris.count;i++)if(tris[i])
	{
		for(int j=0;j<3;j++)ts.Add((*tris[i])[j]);
		delete tris[i];
	}
	tris_count = ts.count/3;
	tris_out   = ts.element;
	ts.element=NULL; ts.count=ts.array_size=0;
	tris.count=0;
	return 1;
}